

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_decimal128(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uStack_40;
  bson_decimal128_t val;
  bson_decimal128_t dec;
  
  bson_decimal128_from_string("12",&dec);
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"foo",uVar2,0x12,&dec,0);
  uVar3 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar2,"foo",uVar3,0x12,&val,0);
  if (cVar1 == '\0') {
    pcVar4 = "BCON_EXTRACT (bcon, \"foo\", BCONE_DECIMAL128 (val))";
    uStack_40 = 0x2c;
  }
  else if (val.low == 0xc) {
    if (val.high == 0x3040000000000000) {
      bson_destroy(uVar2);
      return;
    }
    pcVar4 = "val.high == 0x3040000000000000ULL";
    uStack_40 = 0x2f;
  }
  else {
    pcVar4 = "val.low == 0xCULL";
    uStack_40 = 0x2e;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uStack_40,"test_decimal128",pcVar4);
  abort();
}

Assistant:

static void
test_decimal128 (void)
{
   bson_t bcon, expected;
   bson_decimal128_t dec;
   bson_decimal128_from_string ("120E20", &dec);

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_decimal128 (&expected, "foo", -1, &dec);
   BCON_APPEND (&bcon, "foo", BCON_DECIMAL128 (&dec));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}